

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

ostream * lest::operator<<(ostream *os,comment *note)

{
  size_type sVar1;
  ostream *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  sVar1 = (note->info)._M_string_length;
  if (sVar1 == 0) {
    local_58 = &local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    sVar4 = local_50;
    if (local_58 == &local_48) {
      local_78.field_2._8_8_ = local_48._8_8_;
      local_58 = &local_78.field_2;
    }
    local_78.field_2._M_allocated_capacity = (ulong)(uint7)local_48._M_allocated_capacity._1_7_ << 8
    ;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    paVar3 = &local_48;
    local_38 = local_58;
    if (local_58 == &local_78.field_2) {
      local_28._8_8_ = local_78.field_2._8_8_;
      local_38 = &local_28;
    }
  }
  else {
    std::operator+(&local_78," ",&note->info);
    sVar4 = local_78._M_string_length;
    paVar3 = local_58;
    local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      local_28._8_8_ = local_78.field_2._8_8_;
      local_38 = &local_28;
    }
  }
  local_58 = paVar3;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity =
       local_78.field_2._M_allocated_capacity & 0xffffffffffffff00;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,local_38->_M_local_buf,sVar4);
  if (local_38 != &local_28) {
    operator_delete(local_38);
  }
  paVar3 = &local_78.field_2;
  if (sVar1 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    paVar3 = &local_48;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar3->_M_local_buf + -0x10) != paVar3) {
    operator_delete(*(undefined1 **)(paVar3->_M_local_buf + -0x10));
  }
  return poVar2;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, comment note )
{
    return os << (note ? " " + note.info : "" );
}